

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_set.hpp
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
 __thiscall
itlib::
flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
::insert<std::__cxx11::string>
          (flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  iterator t;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference u;
  void *extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__rhs;
  pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar4;
  byte local_52;
  bool local_51;
  const_iterator local_50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  bool local_39;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  iterator i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_local;
  flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  bool local_10;
  
  i._M_current = val;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       lower_bound<std::__cxx11::string>(this,val);
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this);
  __rhs = &local_38;
  bVar1 = __gnu_cxx::operator!=(&local_30,__rhs);
  local_52 = 0;
  if (bVar1) {
    iVar2 = flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::cmp((flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this,__rhs,extraout_RDX);
    t = i;
    u = __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_30);
    bVar1 = ({parm#1}<{parm#2})itlib::fsimpl::less::operator()
                      ((void *)CONCAT44(extraout_var,iVar2),t._M_current,u);
    local_52 = bVar1 ^ 0xff;
  }
  if ((local_52 & 1) == 0) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_50,&local_30);
    local_48._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
         emplace<std::__cxx11::string>
                   ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                    local_50,i._M_current);
    local_51 = true;
    std::
    pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
                *)&this_local,&local_48,&local_51);
    uVar3 = extraout_RDX_01;
  }
  else {
    local_39 = false;
    std::
    pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
                *)&this_local,&local_30,&local_39);
    uVar3 = extraout_RDX_00;
  }
  pVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar4.second = local_10;
  pVar4.first._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_local;
  return pVar4;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val);
        if (i != end() && !cmp()(val, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }